

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

SourceTextModuleRecord * __thiscall
Js::JavascriptLibrary::GetModuleRecord(JavascriptLibrary *this,uint moduleId)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar5;
  undefined4 *puVar6;
  WriteBarrierPtr *this_00;
  SourceTextModuleRecord **ppSVar7;
  uint moduleId_local;
  JavascriptLibrary *this_local;
  
  pLVar5 = Memory::
           WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->moduleRecordList);
  iVar3 = JsUtil::ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>::
          Count(&pLVar5->
                 super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
               );
  if (-1 < iVar3) {
    pLVar5 = Memory::
             WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
             ::operator->(&this->moduleRecordList);
    uVar4 = JsUtil::ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>::
            Count(&pLVar5->
                   super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
                 );
    if (moduleId < uVar4) goto LAB_0117e8a6;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                              ,0x1c9c,
                              "((moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count()))"
                              ,
                              "(moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count())"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_0117e8a6:
  pLVar5 = Memory::
           WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->moduleRecordList);
  uVar4 = JsUtil::ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>::
          Count(&pLVar5->
                 super_ReadOnlyList<Js::SourceTextModuleRecord_*,_Memory::Recycler,_DefaultComparer>
               );
  if (uVar4 <= moduleId) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  pLVar5 = Memory::
           WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
           ::operator->(&this->moduleRecordList);
  this_00 = (WriteBarrierPtr *)
            JsUtil::
            List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(pLVar5,moduleId);
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SourceTextModuleRecord__(this_00);
  return *ppSVar7;
}

Assistant:

SourceTextModuleRecord* JavascriptLibrary::GetModuleRecord(uint moduleId)
    {
        Assert((moduleRecordList->Count() >= 0) && (moduleId < (uint)moduleRecordList->Count()));
        if (moduleId >= (uint)moduleRecordList->Count())
        {
            Js::Throw::FatalInternalError();
        }
        return moduleRecordList->Item(moduleId);
    }